

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O2

void CVmObjBigNum::compute_sinhcosh_into(char *dst,char *src,int is_cosh,int is_tanh)

{
  err_frame_t *peVar1;
  CVmException *pCVar2;
  undefined8 *puVar3;
  long *plVar4;
  char *ext3;
  char *ext1;
  char *ext2;
  uint hdl4;
  uint hdl3;
  uint hdl2;
  uint hdl1;
  char *ext4;
  err_frame_t err_cur__;
  
  alloc_temp_regs((ulong)*(ushort *)dst + 3,4,&ext1,&hdl1,&ext2,&hdl2,&ext3,&hdl3,&ext4,&hdl4);
  puVar3 = (undefined8 *)_ZTW11G_err_frame();
  err_cur__.prv_ = (err_frame_t *)*puVar3;
  plVar4 = (long *)_ZTW11G_err_frame();
  *plVar4 = (long)&err_cur__;
  err_cur__.state_ = _setjmp((__jmp_buf_tag *)err_cur__.jmpbuf_);
  if (err_cur__.state_ == 0) {
    compute_exp_into(ext1,src);
    copy_val(ext3,(char *)"\x01",0);
    compute_quotient_into(ext2,(char *)0x0,ext3,ext1);
    if (is_tanh == 0) {
      if ((is_cosh == 0) && ((ext2[4] & 8U) == 0)) {
        ext2[4] = ext2[4] ^ 1;
      }
      compute_sum_into(ext3,ext1,ext2);
      div_by_long(ext3,2,(unsigned_long *)0x0);
    }
    else {
      compute_sum_into(ext4,ext1,ext2);
      if ((ext2[4] & 8U) == 0) {
        ext2[4] = ext2[4] ^ 1;
      }
      compute_sum_into(ext3,ext1,ext2);
      compute_quotient_into(ext1,(char *)0x0,ext3,ext4);
      ext3 = ext1;
    }
    copy_val(dst,ext3,1);
  }
  if (-1 < (short)err_cur__.state_) {
    err_cur__.state_ = err_cur__.state_ | 0x8000;
    release_temp_regs(4,(ulong)hdl1,(ulong)hdl2,(ulong)hdl3,(ulong)hdl4);
  }
  peVar1 = err_cur__.prv_;
  puVar3 = (undefined8 *)_ZTW11G_err_frame();
  *puVar3 = peVar1;
  if ((err_cur__.state_ & 0x4001U) != 0) {
    puVar3 = (undefined8 *)_ZTW11G_err_frame();
    if ((*(byte *)*puVar3 & 2) != 0) {
      plVar4 = (long *)_ZTW11G_err_frame();
      free(*(void **)(*plVar4 + 0x10));
    }
    pCVar2 = err_cur__.exc_;
    plVar4 = (long *)_ZTW11G_err_frame();
    *(CVmException **)(*plVar4 + 0x10) = pCVar2;
    err_rethrow();
  }
  if ((err_cur__.state_ & 2U) != 0) {
    free(err_cur__.exc_);
  }
  return;
}

Assistant:

void CVmObjBigNum::compute_sinhcosh_into(char *dst, const char *src,
                                         int is_cosh, int is_tanh)
{
    size_t prec = get_prec(dst);
    uint hdl1, hdl2, hdl3, hdl4;
    char *ext1, *ext2, *ext3, *ext4;
    
    /* allocate some temporary registers */
    alloc_temp_regs(prec + 3, 4,
                    &ext1, &hdl1, &ext2, &hdl2, &ext3, &hdl3,
                    &ext4, &hdl4);
    
    /* catch errors so we can be sure to free registers */
    err_try
    {
        /* 
         *   sinh(x) = (e^x - e^(-x))/2
         *   
         *   cosh(x) = (e^x + e^(-x))/2
         *   
         *   The two differ only in the sign of the e^(-x) term, so most
         *   of the calculation is the same for both.  
         */
        
        /* compute e^x into r1 */
        compute_exp_into(ext1, src);

        /* 
         *   rather than calculating e^-x separately, simply invert our
         *   e^x value to yield e^-x (a simple division is much quicker
         *   than calculating another exponent, which involves an entire
         *   taylor series expansion) 
         */
        copy_val(ext3, get_one(), FALSE);
        compute_quotient_into(ext2, 0, ext3, ext1);

        /* 
         *   if we're calculating the tanh, we'll want both the sinh and
         *   cosh values 
         */
        if (is_tanh)
        {
            /* add the terms to get the cosh */
            compute_sum_into(ext4, ext1, ext2);

            /* subtract ext2 to get the sinh */
            negate(ext2);
            compute_sum_into(ext3, ext1, ext2);

            /* tanh is the quotient of sinh/cosh */
            compute_quotient_into(ext1, 0, ext3, ext4);

            /* our result is in ext1 - set ext3 to point there */
            ext3 = ext1;
        }
        else
        {
            /* 
             *   if this is sinh, the e^-x term is subtracted; if it's
             *   cosh, it's added 
             */
            if (!is_cosh)
                negate(ext2);
        
            /* compute r1 + r2 into r3 (e^x +/- e^(-x)) */
            compute_sum_into(ext3, ext1, ext2);
        
            /* halve the result */
            div_by_long(ext3, 2);
        }
        
        /* store the result */
        copy_val(dst, ext3, TRUE);
    }